

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_changeWindowScale(void)

{
  undefined8 local_10;
  double mtof_zoommul;
  
  if (am_zoomdir <= 0.0) {
    if (0.0 <= am_zoomdir) {
      if (Button_AM_ZoomIn.bDown == '\0') {
        if (Button_AM_ZoomOut.bDown == '\0') {
          local_10 = 1.0;
        }
        else {
          local_10 = 0.9803921568627451;
        }
      }
      else {
        local_10 = 1.02;
      }
    }
    else {
      local_10 = 0.9803921568627451 / -am_zoomdir;
    }
  }
  else {
    local_10 = am_zoomdir * 1.02;
  }
  am_zoomdir = 0.0;
  scale_mtof = scale_mtof * local_10;
  scale_ftom = 1.0 / scale_mtof;
  if (min_scale_mtof <= scale_mtof) {
    if (max_scale_mtof < scale_mtof) {
      AM_maxOutWindowScale();
    }
  }
  else {
    AM_minOutWindowScale();
  }
  return;
}

Assistant:

void AM_changeWindowScale ()
{
	double mtof_zoommul;

	if (am_zoomdir > 0)
	{
		mtof_zoommul = M_ZOOMIN * am_zoomdir;
	}
	else if (am_zoomdir < 0)
	{
		mtof_zoommul = M_ZOOMOUT / -am_zoomdir;
	}
	else if (Button_AM_ZoomIn.bDown)
	{
		mtof_zoommul = M_ZOOMIN;
	}
	else if (Button_AM_ZoomOut.bDown)
	{
		mtof_zoommul = M_ZOOMOUT;
	}
	else
	{
		mtof_zoommul = 1;
	}
	am_zoomdir = 0;

	// Change the scaling multipliers
	scale_mtof = scale_mtof * mtof_zoommul;
	scale_ftom = 1 / scale_mtof;

	if (scale_mtof < min_scale_mtof)
		AM_minOutWindowScale();
	else if (scale_mtof > max_scale_mtof)
		AM_maxOutWindowScale();
}